

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O3

void __thiscall
icu_63::FormatParser::getQuoteLiteral(FormatParser *this,UnicodeString *quote,int32_t *itemIndex)

{
  ushort uVar1;
  short sVar2;
  ushort uVar3;
  short *psVar4;
  char16_t *pcVar5;
  int iVar6;
  int32_t srcLength;
  int iVar7;
  long lVar8;
  UnicodeString *src;
  UnicodeString *src_00;
  uint uVar9;
  ulong uVar10;
  
  iVar7 = *itemIndex;
  uVar10 = (ulong)iVar7;
  uVar1 = (quote->fUnion).fStackFields.fLengthAndFlags;
  uVar3 = 2;
  if ((uVar1 & 1) == 0) {
    uVar3 = uVar1 & 0x1e;
  }
  (quote->fUnion).fStackFields.fLengthAndFlags = uVar3;
  lVar8 = uVar10 * 0x40;
  sVar2 = *(short *)(&this->field_0x10 + lVar8);
  if (sVar2 < 0) {
    iVar6 = *(int *)(&this->field_0x14 + lVar8);
  }
  else {
    iVar6 = (int)sVar2 >> 5;
  }
  if (iVar6 != 0) {
    if (((int)sVar2 & 2U) == 0) {
      psVar4 = *(short **)(&this->field_0x20 + lVar8);
    }
    else {
      psVar4 = (short *)(&this->field_0x12 + lVar8);
    }
    if (*psVar4 == 0x27) {
      icu_63::UnicodeString::doAppend(quote,(UnicodeString *)(&this->field_0x8 + lVar8),0,iVar6);
      uVar10 = (ulong)(iVar7 + 1);
    }
  }
  iVar7 = this->itemNumber;
  uVar9 = (uint)uVar10;
  if ((int)uVar9 < iVar7) {
    do {
      uVar9 = (uint)uVar10;
      lVar8 = (long)(int)uVar9 * 0x40;
      sVar2 = *(short *)(&this->field_0x10 + lVar8);
      if (sVar2 < 0) {
        iVar6 = *(int *)(&this->field_0x14 + lVar8);
      }
      else {
        iVar6 = (int)sVar2 >> 5;
      }
      src = (UnicodeString *)(&this->field_0x8 + lVar8);
      if (iVar6 == 0) {
LAB_002e72af:
        icu_63::UnicodeString::doAppend(quote,src,0,iVar6);
        uVar9 = uVar9 + 1;
      }
      else {
        if (((int)sVar2 & 2U) == 0) {
          pcVar5 = (src->fUnion).fFields.fArray;
        }
        else {
          pcVar5 = (src->fUnion).fStackFields.fBuffer;
        }
        if (*pcVar5 != L'\'') goto LAB_002e72af;
        if (iVar7 <= (int)(uVar9 + 1)) {
LAB_002e7322:
          icu_63::UnicodeString::doAppend(quote,src,0,iVar6);
          break;
        }
        lVar8 = (long)(int)(uVar9 + 1) * 0x40;
        sVar2 = *(short *)(&this->field_0x10 + lVar8);
        if (sVar2 < 0) {
          iVar7 = *(int *)(&this->field_0x14 + lVar8);
        }
        else {
          iVar7 = (int)sVar2 >> 5;
        }
        if (iVar7 == 0) goto LAB_002e7322;
        src_00 = (UnicodeString *)(&this->field_0x8 + lVar8);
        if (((int)sVar2 & 2U) == 0) {
          pcVar5 = (src_00->fUnion).fFields.fArray;
        }
        else {
          pcVar5 = (src_00->fUnion).fStackFields.fBuffer;
        }
        if (*pcVar5 != L'\'') goto LAB_002e7322;
        icu_63::UnicodeString::doAppend(quote,src,0,iVar6);
        sVar2 = (src_00->fUnion).fStackFields.fLengthAndFlags;
        if (sVar2 < 0) {
          srcLength = (src_00->fUnion).fFields.fLength;
        }
        else {
          srcLength = (int)sVar2 >> 5;
        }
        uVar9 = uVar9 + 2;
        icu_63::UnicodeString::doAppend(quote,src_00,0,srcLength);
      }
      uVar10 = (ulong)uVar9;
      iVar7 = this->itemNumber;
    } while ((int)uVar9 < iVar7);
  }
  *itemIndex = uVar9;
  return;
}

Assistant:

void
FormatParser::getQuoteLiteral(UnicodeString& quote, int32_t *itemIndex) {
    int32_t i = *itemIndex;

    quote.remove();
    if (items[i].charAt(0)==SINGLE_QUOTE) {
        quote += items[i];
        ++i;
    }
    while ( i < itemNumber ) {
        if ( items[i].charAt(0)==SINGLE_QUOTE ) {
            if ( (i+1<itemNumber) && (items[i+1].charAt(0)==SINGLE_QUOTE)) {
                // two single quotes e.g. 'o''clock'
                quote += items[i++];
                quote += items[i++];
                continue;
            }
            else {
                quote += items[i];
                break;
            }
        }
        else {
            quote += items[i];
        }
        ++i;
    }
    *itemIndex=i;
}